

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O3

int SaveBinary(path *fname,aint start,aint length)

{
  pointer pcVar1;
  int iVar2;
  FILE *__stream;
  FILE *ff;
  long *local_48 [2];
  long local_38 [2];
  
  __stream = (FILE *)SJ_fopen(fname,"wb");
  ff = __stream;
  if (__stream == (FILE *)0x0) {
    pcVar1 = (fname->_M_pathname)._M_dataplus._M_p;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,pcVar1,pcVar1 + (fname->_M_pathname)._M_string_length);
    Error("opening file for write",(char *)local_48[0],FATAL);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    ff = (FILE *)0x0;
  }
  iVar2 = SaveRAM((FILE *)ff,start,length);
  fclose(__stream);
  return iVar2;
}

Assistant:

int SaveBinary(const std::filesystem::path & fname, aint start, aint length) {
	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "wb")) Error("opening file for write", fname.string().c_str(), FATAL);
	int result = SaveRAM(ff, start, length);
	fclose(ff);
	return result;
}